

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O3

CRCImpl * absl::lts_20250127::crc_internal::CRCImpl::NewInternal(void)

{
  CRCImpl *__s;
  undefined **ppuVar1;
  
  __s = TryNewCRC32AcceleratedX86ARMCombined();
  if (__s == (CRCImpl *)0x0) {
    __s = (CRCImpl *)operator_new(0x2008);
    memset(__s,0,0x2008);
    ppuVar1 = &PTR__CRC_01917e80;
    (__s->super_CRC)._vptr_CRC = (_func_int **)&PTR__CRC_01917e80;
  }
  else {
    ppuVar1 = (__s->super_CRC)._vptr_CRC;
  }
  (*((_func_int **)ppuVar1)[7])(__s);
  return __s;
}

Assistant:

CRCImpl* CRCImpl::NewInternal() {
  // Find an accelearated implementation first.
  CRCImpl* result = TryNewCRC32AcceleratedX86ARMCombined();

  // Fall back to generic implementions if no acceleration is available.
  if (result == nullptr) {
    result = new CRC32();
  }

  result->InitTables();

  return result;
}